

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context__try_get_device_name_by_id
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    char *pName,size_t nameBufferSize)

{
  ma_device_type local_68 [2];
  ma_context__try_get_device_name_by_id__enum_callback_data data;
  ma_result result;
  size_t nameBufferSize_local;
  char *pName_local;
  ma_device_id *pDeviceID_local;
  ma_device_type deviceType_local;
  ma_context *pContext_local;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x241f,
                  "ma_result ma_context__try_get_device_name_by_id(ma_context *, ma_device_type, const ma_device_id *, char *, size_t)"
                 );
  }
  if (pName == (char *)0x0) {
    __assert_fail("pName != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x2420,
                  "ma_result ma_context__try_get_device_name_by_id(ma_context *, ma_device_type, const ma_device_id *, char *, size_t)"
                 );
  }
  if (pDeviceID == (ma_device_id *)0x0) {
    pContext_local._4_4_ = -0x68;
  }
  else {
    data.nameBufferSize._0_4_ = 0;
    local_68[0] = deviceType;
    data._0_8_ = pDeviceID;
    data.pDeviceID = (ma_device_id *)pName;
    data.pName = (char *)nameBufferSize;
    pContext_local._4_4_ =
         ma_context_enumerate_devices
                   (pContext,ma_context__try_get_device_name_by_id__enum_callback,local_68);
    if (pContext_local._4_4_ == 0) {
      if ((int)data.nameBufferSize == 0) {
        pContext_local._4_4_ = -0x68;
      }
      else {
        pContext_local._4_4_ = 0;
      }
    }
  }
  return pContext_local._4_4_;
}

Assistant:

static ma_result ma_context__try_get_device_name_by_id(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, char* pName, size_t nameBufferSize)
{
    ma_result result;
    ma_context__try_get_device_name_by_id__enum_callback_data data;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pName != NULL);

    if (pDeviceID == NULL) {
        return MA_NO_DEVICE;
    }

    data.deviceType = deviceType;
    data.pDeviceID = pDeviceID;
    data.pName = pName;
    data.nameBufferSize = nameBufferSize;
    data.foundDevice = MA_FALSE;
    result = ma_context_enumerate_devices(pContext, ma_context__try_get_device_name_by_id__enum_callback, &data);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (!data.foundDevice) {
        return MA_NO_DEVICE;
    } else {
        return MA_SUCCESS;
    }
}